

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DCFGReader.cpp
# Opt level: O2

void __thiscall DCFGReader::loadCFGs(DCFGReader *this)

{
  uint __line;
  bool bVar1;
  int iVar2;
  reference pbVar3;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *piVar4;
  reference pvVar5;
  _Base_ptr p_Var6;
  primitive_iterator_t pVar7;
  char *__assertion;
  allocator local_119;
  json obj;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  iterator local_50;
  
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&obj,(nullptr_t)0x0);
  it.m_object = (pointer)CONCAT44(it.m_object._4_4_,4);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&(this->m_entries)._M_t,(int *)&it);
  nlohmann::operator>>((istream *)&(this->super_CFGReader).m_input,&obj);
  std::__cxx11::string::string((string *)&local_70,"FILE_NAMES",&local_119);
  it.m_object = (pointer)0x0;
  it.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  it.m_it.array_iterator._M_current =
       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        *)0x0;
  local_108.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  it.m_it.primitive_iterator.m_it = -0x8000000000000000;
  local_108.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (obj.m_type == object) {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::end((iterator *)&local_b0,&obj);
    local_90.m_object = (pointer)local_b0._M_dataplus._M_p;
    local_90.m_it.object_iterator._M_node = (_Base_ptr)local_b0._M_string_length;
    local_90.m_it.array_iterator._M_current =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          *)local_b0.field_2._M_allocated_capacity;
    local_90.m_it.primitive_iterator.m_it = local_b0.field_2._8_8_;
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::find<std::__cxx11::string_const&>((iterator *)&local_b0,&obj,&local_70);
    it.m_object = (pointer)local_b0._M_dataplus._M_p;
    it.m_it.object_iterator._M_node = (_Base_ptr)local_b0._M_string_length;
    it.m_it.array_iterator._M_current =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          *)local_b0.field_2._M_allocated_capacity;
    it.m_it.primitive_iterator.m_it = local_b0.field_2._8_8_;
    bVar1 = nlohmann::detail::
            iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::operator!=(&it,&local_90);
    if (bVar1) {
      pbVar3 = nlohmann::detail::
               iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
               ::operator*(&it);
      if (pbVar3->m_type == array) {
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::begin((iterator *)&local_b0,pbVar3);
        piVar4 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 ::operator++((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                               *)&local_b0);
        it.m_object = piVar4->m_object;
        it.m_it.primitive_iterator.m_it = (piVar4->m_it).primitive_iterator.m_it;
        it.m_it.object_iterator._M_node = (piVar4->m_it).object_iterator._M_node;
        it.m_it.array_iterator._M_current = (piVar4->m_it).array_iterator._M_current;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::end(&local_50,pbVar3);
        local_90.m_object = local_50.m_object;
        local_90.m_it.primitive_iterator.m_it = local_50.m_it.primitive_iterator.m_it;
        local_90.m_it.object_iterator._M_node = local_50.m_it.object_iterator._M_node;
        local_90.m_it.array_iterator._M_current = local_50.m_it.array_iterator._M_current;
        while( true ) {
          bVar1 = nlohmann::detail::
                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                  ::operator!=(&it,&local_90);
          if (!bVar1) break;
          pbVar3 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                   ::operator*(&it);
          pvVar5 = nlohmann::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   ::at(pbVar3,0);
          iVar2 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  ::get<int,_int,_0>(pvVar5);
          pbVar3 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                   ::operator*(&it);
          pvVar5 = nlohmann::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   ::at(pbVar3,1);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::
          get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_b0,pvVar5);
          if ((ulong)((long)local_108.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_108.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5) <= (ulong)(long)iVar2) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::resize(&local_108,(long)(iVar2 + 1));
          }
          std::__cxx11::string::_M_assign
                    ((string *)
                     (local_108.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + iVar2));
          std::__cxx11::string::~string((string *)&local_b0);
          nlohmann::detail::
          iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator++(&it);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_move_assign(&this->m_filenames,&local_108);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_108);
        std::__cxx11::string::~string((string *)&local_70);
        readProcesses(this,&obj);
        for (p_Var6 = (this->m_entries)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var6 != &(this->m_entries)._M_t._M_impl.super__Rb_tree_header;
            p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
          buildCFG(this,p_Var6[1]._M_color);
        }
        CFGReader::cfgs((set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> *)&it,
                        &this->super_CFGReader);
        for (pVar7 = it.m_it.primitive_iterator;
            (internal_iterator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             *)pVar7.m_it != &it.m_it; pVar7.m_it = std::_Rb_tree_increment(pVar7.m_it)) {
          CFG::check(*(CFG **)(pVar7.m_it + 0x20));
        }
        std::_Rb_tree<CFG_*,_CFG_*,_std::_Identity<CFG_*>,_std::less<CFG_*>,_std::allocator<CFG_*>_>
        ::~_Rb_tree((_Rb_tree<CFG_*,_CFG_*,_std::_Identity<CFG_*>,_std::less<CFG_*>,_std::allocator<CFG_*>_>
                     *)&it);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::~basic_json(&obj);
        return;
      }
      __assertion = "array.is_array()";
      __line = 0x32;
    }
    else {
      __assertion = "it != ed";
      __line = 0x2f;
    }
  }
  else {
    __assertion = "obj.is_object()";
    __line = 0x2b;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/DCFGReader.cpp"
                ,__line,"std::vector<std::string> readStrings(json &, const std::string &)");
}

Assistant:

void DCFGReader::loadCFGs() {
	json obj;

	// We consider the first block (4, the first id after the special ones)
	// as an CFG entry.
	m_entries.insert(4);

	m_input >> obj;

	m_filenames = readStrings(obj, "FILE_NAMES");
	readProcesses(obj);

	for (int entry : m_entries)
		this->buildCFG(entry);

	for (CFG* cfg : this->cfgs())
		cfg->check();
}